

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

uint32_t __thiscall
spirv_cross::CompilerGLSL::type_to_packed_base_size
          (CompilerGLSL *this,SPIRType *type,BufferPackingStandard param_2)

{
  uint uVar1;
  CompilerError *this_00;
  undefined4 in_register_00000014;
  
  uVar1 = type->basetype - SByte;
  if ((uVar1 < 0xc) && ((0xeffU >> (uVar1 & 0x1f) & 1) != 0)) {
    return *(uint32_t *)(&DAT_0039a564 + (ulong)uVar1 * 4);
  }
  this_00 = (CompilerError *)
            __cxa_allocate_exception(0x10,type,CONCAT44(in_register_00000014,param_2));
  CompilerError::CompilerError(this_00,"Unrecognized type in type_to_packed_base_size.");
  __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

uint32_t CompilerGLSL::type_to_packed_base_size(const SPIRType &type, BufferPackingStandard)
{
	switch (type.basetype)
	{
	case SPIRType::Double:
	case SPIRType::Int64:
	case SPIRType::UInt64:
		return 8;
	case SPIRType::Float:
	case SPIRType::Int:
	case SPIRType::UInt:
		return 4;
	case SPIRType::Half:
	case SPIRType::Short:
	case SPIRType::UShort:
		return 2;
	case SPIRType::SByte:
	case SPIRType::UByte:
		return 1;

	default:
		SPIRV_CROSS_THROW("Unrecognized type in type_to_packed_base_size.");
	}
}